

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGXMLScanner.cpp
# Opt level: O3

void __thiscall xercesc_4_0::DGXMLScanner::scanCharData(DGXMLScanner *this,XMLBuffer *toUse)

{
  XMLReader *pXVar1;
  XMLCh XVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  XMLSize_t XVar7;
  XMLCh *pXVar8;
  StackElem *pSVar9;
  ulong uVar10;
  XMLSize_t XVar11;
  XMLCh XVar12;
  bool escaped;
  XMLCh nextCh;
  XMLCh secondCh;
  XMLCh tmpBuf [9];
  char local_57;
  XMLCh local_56;
  bool local_53;
  XMLCh local_52;
  XMLBuffer *local_50;
  XMLCh local_48 [12];
  
  toUse->fIndex = 0;
  local_53 = (this->super_XMLScanner).fReaderMgr.fThrowEOE;
  (this->super_XMLScanner).fReaderMgr.fThrowEOE = true;
  local_52 = L'\0';
  local_57 = '\0';
  bVar4 = false;
  local_50 = toUse;
  iVar6 = 0;
LAB_002994cc:
  do {
    if ((iVar6 == 0) && (!bVar4)) {
      pXVar1 = (this->super_XMLScanner).fReaderMgr.fCurReader;
      XVar7 = pXVar1->fCharsAvail - pXVar1->fCharIndex;
      if (XVar7 != 0) {
        XVar11 = 0;
        do {
          if ((pXVar1->fgCharCharsTable[(ushort)(pXVar1->fCharBuf + pXVar1->fCharIndex)[XVar11]] & 8
              ) == 0) {
            XVar7 = XVar11;
            if (XVar11 == 0) goto LAB_00299539;
            break;
          }
          XVar11 = XVar11 + 1;
        } while (XVar7 != XVar11);
        XMLBuffer::append(local_50,pXVar1->fCharBuf + pXVar1->fCharIndex,XVar7);
        pXVar1->fCharIndex = pXVar1->fCharIndex + XVar7;
        pXVar1->fCurCol = pXVar1->fCurCol + XVar7;
      }
    }
LAB_00299539:
    pXVar1 = (this->super_XMLScanner).fReaderMgr.fCurReader;
    uVar10 = pXVar1->fCharIndex;
    if (pXVar1->fCharsAvail <= uVar10) {
      if ((pXVar1->fNoMore != false) || (bVar3 = XMLReader::refreshCharBuffer(pXVar1), !bVar3)) {
LAB_0029960e:
        if (bVar4) {
          XMLScanner::emitError(&this->super_XMLScanner,Expected2ndSurrogateChar);
        }
        if (((this->super_XMLScanner).fValidate == true) &&
           ((this->super_XMLScanner).fStandalone == true)) {
          XVar7 = local_50->fIndex;
          pXVar8 = local_50->fBuffer;
          pXVar8[XVar7] = L'\0';
          bVar4 = XMLReader::containsWhiteSpace
                            ((this->super_XMLScanner).fReaderMgr.fCurReader,pXVar8,XVar7);
          if (bVar4) {
            pSVar9 = ElemStack::topElement(&(this->super_XMLScanner).fElemStack);
            if ((pSVar9->fThisElement->fExternalElement == true) &&
               (iVar6 = (*(pSVar9->fThisElement->super_XSerializable)._vptr_XSerializable[6])(),
               iVar6 == 1)) {
              XMLValidator::emitError((this->super_XMLScanner).fValidator,NoWSForStandalone);
            }
          }
        }
        (*(this->super_XMLScanner).super_XMLBufferFullHandler._vptr_XMLBufferFullHandler[0x10])
                  (this,local_50);
        (this->super_XMLScanner).fReaderMgr.fThrowEOE = local_53;
        return;
      }
      uVar10 = pXVar1->fCharIndex;
    }
    XVar12 = pXVar1->fCharBuf[uVar10];
    if (XVar12 == L'<') goto LAB_0029960e;
    pXVar1->fCharIndex = uVar10 + 1;
    local_56 = XVar12;
    if ((XVar12 & 0xdf50U) == 0) {
      XMLReader::handleEOL(pXVar1,&local_56,false);
    }
    else {
      pXVar1->fCurCol = pXVar1->fCurCol + 1;
    }
    local_57 = '\0';
    if (local_56 == L'&') {
      (*(this->super_XMLScanner).super_XMLBufferFullHandler._vptr_XMLBufferFullHandler[0x10])
                (this,local_50);
      bVar3 = (this->super_XMLScanner).fReaderMgr.fThrowEOE;
      (this->super_XMLScanner).fReaderMgr.fThrowEOE = false;
      iVar5 = (*(this->super_XMLScanner).super_XMLBufferFullHandler._vptr_XMLBufferFullHandler[0xd])
                        (this,0,&local_56,&local_52,&local_57);
      if (iVar5 != 1) {
        (this->super_XMLScanner).fReaderMgr.fThrowEOE = bVar3;
        bVar4 = false;
        goto LAB_002994cc;
      }
      if ((local_57 == '\x01') &&
         (XVar7 = (this->super_XMLScanner).fElemStack.fStackTop, XVar7 != 0)) {
        (this->super_XMLScanner).fElemStack.fStack[XVar7 - 1]->fReferenceEscaped = true;
      }
      (this->super_XMLScanner).fReaderMgr.fThrowEOE = bVar3;
      bVar3 = bVar4;
    }
    else {
      if ((local_56 & 0xfc00U) == 0xdc00) {
        if (!bVar4) {
          XMLScanner::emitError(&this->super_XMLScanner,Unexpected2ndSurrogateChar);
        }
      }
      else {
        if ((local_56 & 0xfc00U) == 0xd800) {
          bVar3 = true;
          if (bVar4) {
            XMLScanner::emitError(&this->super_XMLScanner,Expected2ndSurrogateChar);
            bVar3 = bVar4;
          }
          goto LAB_0029970f;
        }
        if (bVar4) {
          XMLScanner::emitError(&this->super_XMLScanner,Expected2ndSurrogateChar);
        }
        if ((((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable[(ushort)local_56] &
            0x40) == 0) {
          XMLString::binToText
                    ((uint)(ushort)local_56,local_48,8,0x10,(this->super_XMLScanner).fMemoryManager)
          ;
          XMLScanner::emitError
                    (&this->super_XMLScanner,InvalidCharacter,local_48,(XMLCh *)0x0,(XMLCh *)0x0,
                     (XMLCh *)0x0);
        }
      }
      bVar3 = false;
    }
LAB_0029970f:
    bVar4 = bVar3;
    iVar5 = 0;
    XVar12 = local_56;
    if (local_57 == '\0') {
      if (local_56 == L'>') {
        XVar12 = L'>';
        if (iVar6 == 2) {
          XMLScanner::emitError(&this->super_XMLScanner,BadSequenceInCharData);
          XVar12 = local_56;
        }
      }
      else if (local_56 == L']') {
        XVar12 = L']';
        if (iVar6 == 0) {
          iVar5 = 1;
        }
        else {
          iVar5 = iVar6;
          if (iVar6 == 1) {
            iVar5 = 2;
          }
        }
      }
    }
    XVar7 = local_50->fIndex;
    if (XVar7 == local_50->fCapacity) {
      XMLBuffer::ensureCapacity(local_50,1);
      XVar7 = local_50->fIndex;
    }
    XVar2 = local_52;
    pXVar8 = local_50->fBuffer;
    XVar11 = XVar7 + 1;
    local_50->fIndex = XVar11;
    pXVar8[XVar7] = XVar12;
    iVar6 = iVar5;
    if (local_52 != L'\0') {
      if (XVar11 == local_50->fCapacity) {
        XMLBuffer::ensureCapacity(local_50,1);
        XVar11 = local_50->fIndex;
        pXVar8 = local_50->fBuffer;
      }
      local_50->fIndex = XVar11 + 1;
      pXVar8[XVar11] = XVar2;
      local_52 = L'\0';
    }
  } while( true );
}

Assistant:

void DGXMLScanner::scanCharData(XMLBuffer& toUse)
{
    //  We have to watch for the stupid ]]> sequence, which is illegal in
    //  character data. So this is a little state machine that handles that.
    enum States
    {
        State_Waiting
        , State_GotOne
        , State_GotTwo
    };

    // Reset the buffer before we start
    toUse.reset();

    // Turn on the 'throw at end' flag of the reader manager
    ThrowEOEJanitor jan(&fReaderMgr, true);

    //  In order to be more efficient we have to use kind of a deeply nested
    //  set of blocks here. The outer block puts on a try and catches end of
    //  entity exceptions. The inner loop is the per-character loop. If we
    //  put the try inside the inner loop, it would work but would require
    //  the exception handling code setup/teardown code to be invoked for
    //  each character.
    XMLCh   nextCh;
    XMLCh   secondCh = 0;
    States  curState = State_Waiting;
    bool    escaped = false;
    bool    gotLeadingSurrogate = false;
    bool    notDone = true;
    while (notDone)
    {
        try
        {
            while (true)
            {
                //  Eat through as many plain content characters as possible without
                //  needing special handling.  Moving most content characters here,
                //  in this one call, rather than running the overall loop once
                //  per content character, is a speed optimization.
                if (curState == State_Waiting  &&  !gotLeadingSurrogate)
                {
                     fReaderMgr.movePlainContentChars(toUse);
                }

                // Try to get another char from the source
                //   The code from here on down covers all contengencies,
                if (!fReaderMgr.getNextCharIfNot(chOpenAngle, nextCh))
                {
                    // If we were waiting for a trailing surrogate, its an error
                    if (gotLeadingSurrogate)
                        emitError(XMLErrs::Expected2ndSurrogateChar);

                    notDone = false;
                    break;
                }

                //  Watch for a reference. Note that the escapement mechanism
                //  is ignored in this content.
                escaped = false;
                if (nextCh == chAmpersand)
                {
                    sendCharData(toUse);

                    // Turn off the throwing at the end of entity during this
                    ThrowEOEJanitor jan(&fReaderMgr, false);

                    if (scanEntityRef(false, nextCh, secondCh, escaped) != EntityExp_Returned)
                    {
                        gotLeadingSurrogate = false;
                        continue;
                    }
                    else
                    {
                        if (escaped && !fElemStack.isEmpty())
                            fElemStack.setReferenceEscaped();
                    }
                }
                else if ((nextCh >= 0xD800) && (nextCh <= 0xDBFF))
                {
                    // Deal with surrogate pairs
                    //  Its a leading surrogate. If we already got one, then
                    //  issue an error, else set leading flag to make sure that
                    //  we look for a trailing next time.
                    if (gotLeadingSurrogate)
                        emitError(XMLErrs::Expected2ndSurrogateChar);
                    else
                        gotLeadingSurrogate = true;
                }
                else
                {
                    //  If its a trailing surrogate, make sure that we are
                    //  prepared for that. Else, its just a regular char so make
                    //  sure that we were not expected a trailing surrogate.
                    if ((nextCh >= 0xDC00) && (nextCh <= 0xDFFF))
                    {
                        // Its trailing, so make sure we were expecting it
                        if (!gotLeadingSurrogate)
                            emitError(XMLErrs::Unexpected2ndSurrogateChar);
                    }
                    else
                    {
                        //  Its just a char, so make sure we were not expecting a
                        //  trailing surrogate.
                        if (gotLeadingSurrogate)
                            emitError(XMLErrs::Expected2ndSurrogateChar);

                        // Make sure the returned char is a valid XML char
                        if (!fReaderMgr.getCurrentReader()->isXMLChar(nextCh))
                        {
                            XMLCh tmpBuf[9];
                            XMLString::binToText
                            (
                                nextCh
                                , tmpBuf
                                , 8
                                , 16
                                , fMemoryManager
                            );
                            emitError(XMLErrs::InvalidCharacter, tmpBuf);
                        }
                    }
                    gotLeadingSurrogate = false;
                }

                 // Keep the state machine up to date
                if (!escaped)
                {
                    if (nextCh == chCloseSquare)
                    {
                        if (curState == State_Waiting)
                            curState = State_GotOne;
                        else if (curState == State_GotOne)
                            curState = State_GotTwo;
                    }
                    else if (nextCh == chCloseAngle)
                    {
                        if (curState == State_GotTwo)
                            emitError(XMLErrs::BadSequenceInCharData);
                        curState = State_Waiting;
                    }
                    else
                    {
                        curState = State_Waiting;
                    }
                }
                else
                {
                    curState = State_Waiting;
                }

                // Add this char to the buffer
                toUse.append(nextCh);

                if (secondCh)
                {
                    toUse.append(secondCh);
                    secondCh=0;
                }
            }
        }
        catch(const EndOfEntityException& toCatch)
        {
            //  Some entity ended, so we have to send any accumulated
            //  chars and send an end of entity event.
            sendCharData(toUse);
            gotLeadingSurrogate = false;

            if (fDocHandler)
                fDocHandler->endEntityReference(toCatch.getEntity());
        }
    }

    // Check the validity constraints as per XML 1.0 Section 2.9
    if (fValidate && fStandalone)
    {
        // See if the text contains whitespace
        // Get the raw data we need for the callback
        const XMLCh* rawBuf = toUse.getRawBuffer();
        const XMLSize_t len = toUse.getLen();
        const bool isSpaces = fReaderMgr.getCurrentReader()->containsWhiteSpace(rawBuf, len);

        if (isSpaces)
        {
            // And see if the current element is a 'Children' style content model
            const ElemStack::StackElem* topElem = fElemStack.topElement();

            if (topElem->fThisElement->isExternal()) {

                // Get the character data opts for the current element
                XMLElementDecl::CharDataOpts charOpts =  topElem->fThisElement->getCharDataOpts();

                if (charOpts == XMLElementDecl::SpacesOk)  // => Element Content
                {
                    // Error - standalone should have a value of "no" as whitespace detected in an
                    // element type with element content whose element declaration was external
                    //
                    fValidator->emitError(XMLValid::NoWSForStandalone);
                }
            }
        }
    }
    // Send any char data that we accumulated into the buffer
    sendCharData(toUse);
}